

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> *
ising::dos::square::count
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,uint_t Lx,
          uint_t Ly)

{
  pointer puVar1;
  pointer puVar2;
  ulong uVar3;
  range_error *this;
  size_t *psVar4;
  uint_t energy;
  long lVar5;
  long lVar6;
  bool bVar7;
  allocator_type local_e1;
  graph graph;
  span_t local_90;
  unitcell unitcell;
  basis basis;
  
  lattice::basis::simple(&basis,2);
  unitcell.dim_ = 2;
  unitcell.sites_.
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  unitcell.sites_.
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  unitcell.sites_.
  super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  unitcell.bonds_.
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  unitcell.bonds_.
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  unitcell.bonds_.
  super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lattice::coordinate((lattice *)&graph,0.0,0.0);
  lattice::unitcell::add_site(&unitcell,(coordinate_t *)&graph,0);
  free((void *)graph.dim_);
  lattice::offset((lattice *)&graph,1,0);
  lattice::unitcell::add_bond(&unitcell,0,0,(offset_t *)&graph,0);
  free((void *)graph.dim_);
  lattice::offset((lattice *)&graph,0,1);
  lattice::unitcell::add_bond(&unitcell,0,0,(offset_t *)&graph,0);
  free((void *)graph.dim_);
  lattice::extent(&local_90,Lx,Ly);
  lattice::graph::graph(&graph,&basis,&unitcell,&local_90,periodic);
  free(local_90.super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  uVar3 = ((long)graph.bonds_.
                 super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)graph.bonds_.
                super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x18;
  if (uVar3 < 0x40) {
    local_90.super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (long *)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (__return_storage_ptr__,uVar3 + 1,(value_type_conflict3 *)&local_90,&local_e1);
    puVar2 = (__return_storage_ptr__->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar3 = 0;
        uVar3 != (long)(1 << ((byte)(((long)graph.sites_.
                                            super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)graph.sites_.
                                           super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                                           ._M_impl.super__Vector_impl_data._M_start) / 0x38) & 0x1f
                             )); uVar3 = uVar3 + 1) {
      lVar5 = 0;
      psVar4 = &(graph.bonds_.
                 super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                 ._M_impl.super__Vector_impl_data._M_start)->target;
      lVar6 = ((long)graph.bonds_.
                     super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)graph.bonds_.
                    super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x18;
      while (bVar7 = lVar6 != 0, lVar6 = lVar6 + -1, bVar7) {
        lVar5 = lVar5 + (ulong)(((uint)(uVar3 >> ((byte)*psVar4 & 0x3f)) ^
                                (uint)(uVar3 >> ((byte)((bond_t *)(psVar4 + -1))->source & 0x3f))) &
                               1);
        psVar4 = psVar4 + 3;
      }
      puVar1 = puVar2 + lVar5;
      *puVar1 = *puVar1 + 1;
    }
    lattice::graph::~graph(&graph);
    lattice::unitcell::~unitcell(&unitcell);
    free(basis.basis_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_data);
    return __return_storage_ptr__;
  }
  this = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this,"Error: system size is too large\n");
  __cxa_throw(this,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

std::vector<uint_t> count(uint_t Lx, uint_t Ly) {
  auto basis = lattice::basis::simple(2);
  auto unitcell = lattice::unitcell(2);
  unitcell.add_site(lattice::coordinate(0, 0), 0);
  unitcell.add_bond(0, 0, lattice::offset(1, 0), 0);
  unitcell.add_bond(0, 0, lattice::offset(0, 1), 0);
  auto graph = lattice::graph(basis, unitcell, lattice::extent(Lx, Ly));
  if (graph.num_bonds() >= std::numeric_limits<uint_t>::digits)
    throw std::range_error("Error: system size is too large\n");
  
  std::vector<uint_t> dos(graph.num_bonds() + 1, 0);
  uint_t num_states = 1 << graph.num_sites();
  for (uint_t c = 0; c < num_states; ++c) {
    uint_t energy = 0;
    for (uint_t b = 0; b < graph.num_bonds(); ++b) {
      uint_t ci = (c >> graph.source(b)) & 1;
      uint_t cj = (c >> graph.target(b)) & 1;
      energy += (ci ^ cj);
    }
    ++dos[energy];
  }
  return dos;
}